

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cc
# Opt level: O3

void __thiscall gimage::VEdge::VEdge(VEdge *this,long x0,long y0,long x1,long y1)

{
  long lVar1;
  long lVar2;
  
  lVar1 = y0;
  lVar2 = x1;
  if (y1 < y0) {
    lVar1 = y1;
    y1 = y0;
    lVar2 = x0;
    x0 = x1;
  }
  this->ymin = lVar1;
  this->ymax = y1;
  this->xstart = x0;
  this->xend = lVar2;
  this->xc = x0;
  return;
}

Assistant:

VEdge::VEdge(long x0, long y0, long x1, long y1)
{
  if (y0 <= y1)
  {
    ymin=y0;
    ymax=y1;
    xstart=x0;
    xend=x1;
  }
  else if (y1 < y0)
  {
    ymin=y1;
    ymax=y0;
    xstart=x1;
    xend=x0;
  }

  xc=xstart;
}